

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void convert_32s_C3P3(OPJ_INT32 *pSrc,OPJ_INT32 **pDst,OPJ_SIZE_T length)

{
  OPJ_INT32 *pOVar1;
  OPJ_INT32 *pOVar2;
  OPJ_INT32 *pOVar3;
  OPJ_INT32 *pOVar4;
  OPJ_SIZE_T OVar5;
  
  if (length != 0) {
    pOVar1 = *pDst;
    pOVar2 = pDst[1];
    pOVar3 = pDst[2];
    pOVar4 = pSrc + 2;
    OVar5 = 0;
    do {
      pOVar1[OVar5] = pOVar4[-2];
      pOVar2[OVar5] = pOVar4[-1];
      pOVar3[OVar5] = *pOVar4;
      OVar5 = OVar5 + 1;
      pOVar4 = pOVar4 + 3;
    } while (length != OVar5);
  }
  return;
}

Assistant:

static void convert_32s_C3P3(const OPJ_INT32* pSrc, OPJ_INT32* const* pDst,
                             OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    OPJ_INT32* pDst0 = pDst[0];
    OPJ_INT32* pDst1 = pDst[1];
    OPJ_INT32* pDst2 = pDst[2];

    for (i = 0; i < length; i++) {
        pDst0[i] = pSrc[3 * i + 0];
        pDst1[i] = pSrc[3 * i + 1];
        pDst2[i] = pSrc[3 * i + 2];
    }
}